

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O3

Abc_Obj_t * Abc_NtkCreateObj(Abc_Ntk_t *pNtk,Abc_ObjType_t Type)

{
  uint uVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  
  pAVar3 = Abc_ObjAlloc(pNtk,Type);
  pVVar5 = pNtk->vObjs;
  uVar1 = pVVar5->nSize;
  pAVar3->Id = uVar1;
  if (uVar1 == pVVar5->nCap) {
    if ((int)uVar1 < 0x10) {
      if (pVVar5->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar5->pArray,0x80);
      }
      pVVar5->pArray = ppvVar4;
      pVVar5->nCap = 0x10;
    }
    else {
      if (pVVar5->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar5->pArray,(ulong)uVar1 << 4);
      }
      pVVar5->pArray = ppvVar4;
      pVVar5->nCap = uVar1 * 2;
    }
  }
  else {
    ppvVar4 = pVVar5->pArray;
  }
  iVar2 = pVVar5->nSize;
  pVVar5->nSize = iVar2 + 1;
  ppvVar4[iVar2] = pAVar3;
  pNtk->nObjCounts[Type] = pNtk->nObjCounts[Type] + 1;
  pNtk->nObjs = pNtk->nObjs + 1;
  switch((ulong)Type) {
  case 0:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcObj.c"
                  ,0x7a,"Abc_Obj_t *Abc_NtkCreateObj(Abc_Ntk_t *, Abc_ObjType_t)");
  case 1:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcObj.c"
                  ,0x7d,"Abc_Obj_t *Abc_NtkCreateObj(Abc_Ntk_t *, Abc_ObjType_t)");
  case 2:
    pVVar5 = pNtk->vPis;
    uVar1 = pVVar5->nSize;
    if (uVar1 == pVVar5->nCap) {
      if ((int)uVar1 < 0x10) {
        if (pVVar5->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc(0x80);
        }
        else {
          ppvVar4 = (void **)realloc(pVVar5->pArray,0x80);
        }
        pVVar5->pArray = ppvVar4;
        pVVar5->nCap = 0x10;
      }
      else {
        if (pVVar5->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar4 = (void **)realloc(pVVar5->pArray,(ulong)uVar1 << 4);
        }
        pVVar5->pArray = ppvVar4;
        pVVar5->nCap = uVar1 * 2;
      }
    }
    else {
      ppvVar4 = pVVar5->pArray;
    }
    iVar2 = pVVar5->nSize;
    pVVar5->nSize = iVar2 + 1;
    ppvVar4[iVar2] = pAVar3;
    pVVar5 = pNtk->vCis;
    goto LAB_001e966d;
  case 3:
    pVVar5 = pNtk->vPos;
    uVar1 = pVVar5->nSize;
    if (uVar1 == pVVar5->nCap) {
      if ((int)uVar1 < 0x10) {
        if (pVVar5->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc(0x80);
        }
        else {
          ppvVar4 = (void **)realloc(pVVar5->pArray,0x80);
        }
        pVVar5->pArray = ppvVar4;
        pVVar5->nCap = 0x10;
      }
      else {
        if (pVVar5->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar4 = (void **)realloc(pVVar5->pArray,(ulong)uVar1 << 4);
        }
        pVVar5->pArray = ppvVar4;
        pVVar5->nCap = uVar1 * 2;
      }
    }
    else {
      ppvVar4 = pVVar5->pArray;
    }
    iVar2 = pVVar5->nSize;
    pVVar5->nSize = iVar2 + 1;
    ppvVar4[iVar2] = pAVar3;
    pVVar5 = pNtk->vCos;
    goto LAB_001e966d;
  case 4:
    pVVar5 = pNtk->vCos;
    break;
  case 5:
    pVVar5 = pNtk->vCis;
    break;
  case 6:
  case 7:
    goto switchD_001e9538_caseD_6;
  case 8:
    (pAVar3->field_5).pData = (void *)0x0;
  case 9:
  case 10:
    pVVar5 = pNtk->vBoxes;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcObj.c"
                  ,0x99,"Abc_Obj_t *Abc_NtkCreateObj(Abc_Ntk_t *, Abc_ObjType_t)");
  }
  if (pVVar5 != (Vec_Ptr_t *)0x0) {
LAB_001e966d:
    uVar1 = pVVar5->nSize;
    if (uVar1 == pVVar5->nCap) {
      if ((int)uVar1 < 0x10) {
        if (pVVar5->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc(0x80);
        }
        else {
          ppvVar4 = (void **)realloc(pVVar5->pArray,0x80);
        }
        pVVar5->pArray = ppvVar4;
        pVVar5->nCap = 0x10;
      }
      else {
        if (pVVar5->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar4 = (void **)realloc(pVVar5->pArray,(ulong)uVar1 << 4);
        }
        pVVar5->pArray = ppvVar4;
        pVVar5->nCap = uVar1 * 2;
      }
    }
    else {
      ppvVar4 = pVVar5->pArray;
    }
    iVar2 = pVVar5->nSize;
    pVVar5->nSize = iVar2 + 1;
    ppvVar4[iVar2] = pAVar3;
  }
switchD_001e9538_caseD_6:
  return pAVar3;
}

Assistant:

Abc_Obj_t * Abc_NtkCreateObj( Abc_Ntk_t * pNtk, Abc_ObjType_t Type )
{
    Abc_Obj_t * pObj;
    // create new object, assign ID, and add to the array
    pObj = Abc_ObjAlloc( pNtk, Type );
    pObj->Id = pNtk->vObjs->nSize;
    Vec_PtrPush( pNtk->vObjs, pObj );
    pNtk->nObjCounts[Type]++;
    pNtk->nObjs++;
    // perform specialized operations depending on the object type
    switch (Type)
    {
        case ABC_OBJ_NONE:   
            assert(0); 
            break;
        case ABC_OBJ_CONST1: 
            assert(0); 
            break;
        case ABC_OBJ_PI:
//            pObj->iTemp = Vec_PtrSize(pNtk->vCis);
            Vec_PtrPush( pNtk->vPis, pObj );
            Vec_PtrPush( pNtk->vCis, pObj );
            break;
        case ABC_OBJ_PO:     
//            pObj->iTemp = Vec_PtrSize(pNtk->vCos);
            Vec_PtrPush( pNtk->vPos, pObj );
            Vec_PtrPush( pNtk->vCos, pObj );
            break;
        case ABC_OBJ_BI:     
            if ( pNtk->vCos ) Vec_PtrPush( pNtk->vCos, pObj );
            break;
        case ABC_OBJ_BO:     
            if ( pNtk->vCis ) Vec_PtrPush( pNtk->vCis, pObj );
            break;
        case ABC_OBJ_NET:  
        case ABC_OBJ_NODE: 
            break;
        case ABC_OBJ_LATCH:     
            pObj->pData = (void *)ABC_INIT_NONE;
        case ABC_OBJ_WHITEBOX:     
        case ABC_OBJ_BLACKBOX:     
            if ( pNtk->vBoxes ) Vec_PtrPush( pNtk->vBoxes, pObj );
            break;
        default:
            assert(0); 
            break;
    }
    return pObj;
}